

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O3

BYTE * __thiscall FBehavior::NextChunk(FBehavior *this,BYTE *chunk)

{
  int *piVar1;
  
  piVar1 = (int *)(chunk + (*(int *)(chunk + 4) + 8));
  if (piVar1 < this->Data + this->DataSize) {
    do {
      if (*piVar1 == *(int *)chunk) {
        return (BYTE *)piVar1;
      }
      piVar1 = (int *)((long)piVar1 + (ulong)(piVar1[1] + 8));
    } while (piVar1 < this->Data + this->DataSize);
  }
  return (BYTE *)0x0;
}

Assistant:

BYTE *FBehavior::NextChunk (BYTE *chunk) const
{
	DWORD id = *(DWORD *)chunk;
	chunk += LittleLong(((DWORD *)chunk)[1]) + 8;
	while (chunk != NULL && chunk < Data + DataSize)
	{
		if (((DWORD *)chunk)[0] == id)
		{
			return chunk;
		}
		chunk += LittleLong(((DWORD *)chunk)[1]) + 8;
	}
	return NULL;
}